

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderIntermediate.h
# Opt level: O2

void __thiscall
Assimp::Blender::TempArray<std::vector,_aiCamera>::~TempArray
          (TempArray<std::vector,_aiCamera> *this)

{
  pointer ppaVar1;
  mywrap *__range3;
  pointer ppaVar2;
  
  ppaVar1 = (this->arr).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppaVar2 = (this->arr).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppaVar2 != ppaVar1; ppaVar2 = ppaVar2 + 1) {
    operator_delete(*ppaVar2);
  }
  ::std::_Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>::~_Vector_base
            ((_Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_> *)this);
  return;
}

Assistant:

~TempArray () {
            for(T* elem : arr) {
                delete elem;
            }
        }